

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> * __thiscall
pbrt::ParameterDictionary::GetSpectrumArray
          (vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
           *__return_storage_ptr__,ParameterDictionary *this,string *name,SpectrumType spectrumType,
          Allocator alloc)

{
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar1;
  size_t sVar2;
  ParsedParameter *param;
  bool bVar3;
  long lVar4;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar5;
  
  paVar1 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar2 = (this->params).nStored;
  paVar5 = &(this->params).field_2;
  if (paVar1 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar5 = paVar1;
  }
  lVar4 = 0;
  do {
    if (sVar2 << 3 == lVar4) {
      (__return_storage_ptr__->
      super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      return __return_storage_ptr__;
    }
    param = *(ParsedParameter **)((long)paVar5 + lVar4);
    bVar3 = std::operator!=(&param->name,name);
    if (!bVar3) {
      extractSpectrumArray(__return_storage_ptr__,this,param,spectrumType,alloc);
      if ((__return_storage_ptr__->
          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
          super__Vector_impl_data._M_start !=
          (__return_storage_ptr__->
          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        return __return_storage_ptr__;
      }
      std::_Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::~_Vector_base
                (&__return_storage_ptr__->
                  super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>);
    }
    lVar4 = lVar4 + 8;
  } while( true );
}

Assistant:

std::vector<SpectrumHandle> ParameterDictionary::GetSpectrumArray(
    const std::string &name, SpectrumType spectrumType, Allocator alloc) const {
    for (const ParsedParameter *p : params) {
        if (p->name != name)
            continue;

        std::vector<SpectrumHandle> s = extractSpectrumArray(*p, spectrumType, alloc);
        if (!s.empty())
            return s;
    }
    return {};
}